

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Promise<void> __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::tailCall
          (MembraneCallContextHook *this,Own<capnp::RequestHook> *request)

{
  CallContextHook *pCVar1;
  Own<capnp::RequestHook> *inner;
  RefOrVoid<capnp::MembranePolicy> policy;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<capnp::RequestHook> *local_20;
  Own<capnp::RequestHook> *request_local;
  MembraneCallContextHook *this_local;
  
  local_20 = in_RDX;
  request_local = request;
  this_local = this;
  pCVar1 = kj::Own<capnp::CallContextHook>::operator->
                     ((Own<capnp::CallContextHook> *)&request[1].ptr);
  inner = kj::mv<kj::Own<capnp::RequestHook>>(local_20);
  policy = kj::Own<capnp::MembranePolicy>::operator*((Own<capnp::MembranePolicy> *)&request[2].ptr);
  MembraneRequestHook::wrap
            ((MembraneRequestHook *)&stack0xffffffffffffffd0,inner,policy,
             (bool)(~*(byte *)&request[3].ptr & 1));
  (*pCVar1->_vptr_CallContextHook[3])(this,pCVar1,(MembraneRequestHook *)&stack0xffffffffffffffd0);
  kj::Own<capnp::RequestHook>::~Own((Own<capnp::RequestHook> *)&stack0xffffffffffffffd0);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    return inner->tailCall(MembraneRequestHook::wrap(kj::mv(request), *policy, !reverse));
  }